

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value-types.hh
# Opt level: O0

array<float,_3UL>
tinyusdz::value::MultV<tinyusdz::value::matrix4d,std::array<float,3ul>,double,float,3ul>
          (matrix4d *m,array<float,_3UL> *v)

{
  double dVar1;
  const_reference pvVar2;
  reference pvVar3;
  array<float,_3UL> aVar4;
  ulong local_40;
  size_t i;
  Ty value;
  size_t j;
  array<float,_3UL> *v_local;
  matrix4d *m_local;
  undefined4 uStack_10;
  array<float,_3UL> ret;
  undefined8 uVar5;
  
  for (value = 0.0; (ulong)value < 3; value = (Ty)((long)value + 1)) {
    i = 0;
    for (local_40 = 0; local_40 < 3; local_40 = local_40 + 1) {
      dVar1 = m->m[local_40][(long)value];
      pvVar2 = ::std::array<float,_3UL>::operator[](v,local_40);
      i = (size_t)(dVar1 * (double)*pvVar2 + (double)i);
    }
    pvVar3 = ::std::array<float,_3UL>::operator[]
                       ((array<float,_3UL> *)((long)&m_local + 4),(size_type)value);
    *pvVar3 = (float)(double)i;
  }
  aVar4._M_elems[0] = (float)m_local._4_4_;
  uVar5._4_4_ = (float)uStack_10;
  aVar4._M_elems[2] = ret._M_elems[0];
  return (array<float,_3UL>)aVar4._M_elems;
}

Assistant:

VTy MultV(const MTy &m, const VTy &v) {
  // MBaseTy must be float or double
  // TODO: use std::enable_if?
  static_assert(std::is_same<MBaseTy, double>::value || std::is_same<MBaseTy, float>::value,
    "Matrix element type must be `float` or `double`");

  // Intermediate type. Choose higher precision based on its size.
  typedef typename std::conditional<sizeof(MBaseTy) >= sizeof(VBaseTy), MBaseTy, VBaseTy>::type Ty;

  VTy ret;

  for (size_t j = 0; j < N; j++) {
    Ty value = static_cast<Ty>(0);
    for (size_t i = 0; i < N; i++) {
      value += static_cast<Ty>(m.m[i][j]) * static_cast<Ty>(v[i]);
    }
    ret[j] = static_cast<VBaseTy>(value);
  }

  return ret;
}